

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ralocal_p.h
# Opt level: O1

Error __thiscall
asmjit::RALocalAllocator::onSaveReg
          (RALocalAllocator *this,uint32_t group,uint32_t workId,uint32_t physId)

{
  uint32_t *puVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  byte bVar5;
  Error EVar6;
  undefined8 in_RAX;
  undefined4 in_register_00000034;
  int *piVar7;
  long lVar8;
  
  piVar7 = (int *)CONCAT44(in_register_00000034,group);
  if (workId == 0xffffffff) {
    onSaveReg();
LAB_0011e98d:
    onSaveReg();
LAB_0011e992:
    onSaveReg();
LAB_0011e997:
    onSaveReg();
  }
  else {
    if ((this->_curAssignment)._layout.workCount <= workId) goto LAB_0011e98d;
    if ((this->_curAssignment)._workToPhysMap[workId].physIds[0] != physId) goto LAB_0011e992;
    if (0x1f < physId) goto LAB_0011e997;
    if ((this->_curAssignment)._physToWorkIds[group][physId] == workId) {
      if (group < 4) {
        bVar5 = (byte)physId & 0x1f;
        puVar1 = (((this->_curAssignment)._physToWorkMap)->dirty)._masks + group;
        *puVar1 = *puVar1 & (-2 << bVar5 | 0xfffffffeU >> 0x20 - bVar5);
        EVar6 = (*(this->_pass->super_FuncPass).super_Pass._vptr_Pass[0xc])
                          (this->_pass,(ulong)workId,(ulong)physId,in_RAX);
        return EVar6;
      }
      goto LAB_0011e9a1;
    }
  }
  onSaveReg();
LAB_0011e9a1:
  onSaveReg();
  if ((((*(int *)&this->_pass == *piVar7) && (*(int *)((long)&this->_pass + 4) == piVar7[1])) &&
      (iVar2 = *(int *)&this->_cc, iVar2 == piVar7[2])) &&
     ((iVar3 = *(int *)((long)&this->_cc + 4), iVar3 == piVar7[3] &&
      (this->_archTraits == *(ArchTraits **)(piVar7 + 4))))) {
    if (iVar2 != 0) {
      lVar8 = 0;
      do {
        if (*(int *)(*(long *)((this->_availableRegs)._masks + 2) + 0x20 + lVar8 * 4) !=
            *(int *)(*(long *)(piVar7 + 8) + 0x20 + lVar8 * 4)) {
          return 0;
        }
        lVar8 = lVar8 + 1;
      } while (iVar2 != (int)lVar8);
    }
    if (iVar3 != 0) {
      lVar8 = 0;
      do {
        if (*(char *)(*(long *)(this->_availableRegs)._masks + lVar8) !=
            *(char *)(*(long *)(piVar7 + 6) + lVar8)) {
          return 0;
        }
        lVar8 = lVar8 + 1;
      } while (iVar3 != (int)lVar8);
    }
    piVar4 = *(int **)((this->_availableRegs)._masks + 2);
    piVar7 = *(int **)(piVar7 + 8);
    if ((((*piVar4 == *piVar7) && (piVar4[1] == piVar7[1])) &&
        ((piVar4[2] == piVar7[2] &&
         (((piVar4[3] == piVar7[3] && (piVar4[4] == piVar7[4])) && (piVar4[5] == piVar7[5])))))) &&
       (piVar4[6] == piVar7[6])) {
      return CONCAT31((int3)((uint)piVar4[7] >> 8),piVar4[7] == piVar7[7]);
    }
  }
  return 0;
}

Assistant:

inline Error onSaveReg(uint32_t group, uint32_t workId, uint32_t physId) noexcept {
    ASMJIT_ASSERT(_curAssignment.workToPhysId(group, workId) == physId);
    ASMJIT_ASSERT(_curAssignment.physToWorkId(group, physId) == workId);

    _curAssignment.makeClean(group, workId, physId);
    return _pass->emitSave(workId, physId);
  }